

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void outputUnitToLaTeX(LaTeX *latex,ofstream *latexOut,Unit *u,uint index)

{
  ostream *poVar1;
  uint in_ECX;
  ostream *in_RSI;
  char *p;
  uint count;
  string stringform;
  char *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  LaTeX *in_stack_ffffffffffffffb8;
  string local_40 [36];
  uint local_1c;
  ostream *local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  Shell::LaTeX::toString_abi_cxx11_
            (in_stack_ffffffffffffffb8,
             (Unit *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  uVar2 = local_1c;
  local_1c = local_1c + 1;
  poVar1 = (ostream *)std::ostream::operator<<(local_10,uVar2);
  std::operator<<(poVar1," & ");
  uVar2 = 0;
  for (local_58 = (char *)std::__cxx11::string::c_str(); *local_58 != '\0'; local_58 = local_58 + 1)
  {
    std::operator<<(local_10,*local_58);
    uVar2 = uVar2 + 1;
    if ((0x50 < uVar2) && (*local_58 == ' ')) {
      std::operator<<(local_10,"\\\\ \n & ~~~~~");
      uVar2 = 0;
    }
  }
  poVar1 = std::operator<<(local_10,"\\\\");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void outputUnitToLaTeX(LaTeX& latex, ofstream& latexOut, Unit* u,unsigned index)
{
    std::string stringform = latex.toString(u);
    latexOut << index++ << " & ";
    unsigned count = 0;
    for(const char* p = stringform.c_str();*p;p++){
      latexOut << *p;
      count++;
      if(count>80 && *p==' '){
        latexOut << "\\\\ \n & ~~~~~";
        count=0;
      }
    }
    latexOut << "\\\\" << endl;
}